

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigIoa.c
# Opt level: O2

Aig_Man_t * Saig_ManReadBlif(char *pFileName)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Aig_Man_t *pFile;
  char *pcVar4;
  Aig_Man_t *p;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t *pAVar6;
  size_t sVar7;
  long lVar8;
  int *pNum2Id;
  void *pvVar9;
  Aig_Obj_t *p0;
  Aig_Man_t *p_00;
  bool bVar10;
  double dVar11;
  undefined1 auVar12 [16];
  int local_54;
  
  pFile = (Aig_Man_t *)fopen(pFileName,"r");
  if (pFile == (Aig_Man_t *)0x0) {
    pcVar4 = "Saig_ManReadBlif(): Cannot open file for reading.";
  }
  else {
    do {
      pcVar4 = Saig_ManReadToken((FILE *)pFile);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "Saig_ManReadBlif(): Error 1.";
        goto LAB_0051941b;
      }
    } while (*pcVar4 != '.');
    pcVar4 = Saig_ManReadToken((FILE *)pFile);
    if (pcVar4 != (char *)0x0) {
      p = Aig_ManStart(10000);
      pcVar4 = Abc_UtilStrsav(pcVar4);
      p->pName = pcVar4;
      pcVar4 = Abc_UtilStrsav(pFileName);
      p->pSpec = pcVar4;
      pcVar4 = Saig_ManReadToken((FILE *)pFile);
      if ((pcVar4 == (char *)0x0) || (iVar1 = strcmp(pcVar4,".inputs"), iVar1 != 0)) {
        pcVar4 = "Saig_ManReadBlif(): Error 3.";
      }
      else {
        iVar1 = 0;
        while (pcVar4 = Saig_ManReadToken((FILE *)pFile), pcVar4 != (char *)0x0) {
          if (*pcVar4 == '.') {
            iVar2 = strcmp(pcVar4,".outputs");
            if (iVar2 == 0) {
              iVar2 = 0;
              goto LAB_0051946b;
            }
            break;
          }
          iVar1 = iVar1 + 1;
        }
        pcVar4 = "Saig_ManReadBlif(): Error 4.";
      }
      goto LAB_005193f3;
    }
    pcVar4 = "Saig_ManReadBlif(): Error 2.";
  }
LAB_0051941b:
  puts(pcVar4);
  return (Aig_Man_t *)0x0;
LAB_0051946b:
  pcVar4 = Saig_ManReadToken((FILE *)pFile);
  if (pcVar4 == (char *)0x0) goto LAB_00519485;
  if (*pcVar4 == '.') {
    local_54 = 0;
    goto LAB_005194a0;
  }
  iVar2 = iVar2 + 1;
  goto LAB_0051946b;
LAB_00519485:
  pcVar4 = "Saig_ManReadBlif(): Error 5.";
  goto LAB_005193f3;
LAB_005194a0:
  iVar3 = strcmp(pcVar4,".latch");
  if (iVar3 != 0) goto LAB_005194fc;
  pcVar4 = Saig_ManReadToken((FILE *)pFile);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "Saig_ManReadBlif(): Error 6.";
    goto LAB_005193f3;
  }
  pcVar4 = Saig_ManReadToken((FILE *)pFile);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "Saig_ManReadBlif(): Error 7.";
    goto LAB_005193f3;
  }
  pcVar4 = Saig_ManReadToken((FILE *)pFile);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "Saig_ManReadBlif(): Error 8.";
    goto LAB_005193f3;
  }
  pcVar4 = Saig_ManReadToken((FILE *)pFile);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = "Saig_ManReadBlif(): Error 9.";
    goto LAB_005193f3;
  }
  local_54 = local_54 + -1;
  goto LAB_005194a0;
LAB_005194fc:
  iVar1 = iVar1 - local_54;
  while (bVar10 = iVar1 != 0, iVar1 = iVar1 + -1, bVar10) {
    Aig_ObjCreateCi(p);
  }
  Aig_ManSetRegNum(p,-local_54);
  iVar1 = 0;
  pNum2Id = (int *)0x0;
  do {
    while( true ) {
      while( true ) {
        iVar3 = strcmp(pcVar4,".names");
        if (iVar3 != 0) {
          iVar1 = strcmp(pcVar4,".end");
          if (iVar1 == 0) {
            if (iVar2 == local_54 + p->nObjs[3]) {
              for (iVar1 = 0; iVar1 < p->vCis->nSize; iVar1 = iVar1 + 1) {
                pvVar9 = Vec_PtrEntry(p->vCis,iVar1);
                pNum2Id[*(int *)((long)pvVar9 + 0x24)] = *(int *)((long)pvVar9 + 0x24);
              }
              p->pData = pNum2Id;
              Aig_ManSetRegNum(p,-local_54);
              iVar1 = Aig_ManCheck(p);
              if (iVar1 == 0) {
                puts("Saig_ManReadBlif(): Check has failed.");
                return p;
              }
              return p;
            }
            pcVar4 = "Saig_ManReadBlif(): Error 20.";
          }
          else {
            pcVar4 = "Saig_ManReadBlif(): Error 19.";
          }
          goto LAB_005193f3;
        }
        pcVar4 = Saig_ManReadToken((FILE *)pFile);
        bVar10 = iVar1 != 0;
        iVar1 = iVar1 + -1;
        if ((bVar10) || (*pcVar4 != 'n')) break;
        pcVar4 = Saig_ManReadToken((FILE *)pFile);
        if (((pcVar4 == (char *)0x0) || (*pcVar4 != '1')) || (pcVar4[1] != '\0')) {
          pcVar4 = "Saig_ManReadBlif(): Error 10.";
          goto LAB_005193f3;
        }
        pcVar4 = Saig_ManReadToken((FILE *)pFile);
        if (pcVar4 == (char *)0x0) {
          pcVar4 = "Saig_ManReadBlif(): Error 11.";
          goto LAB_005193f3;
        }
      }
      pAVar5 = Saig_ManReadNode(p,pNum2Id,pcVar4);
      pcVar4 = Saig_ManReadToken((FILE *)pFile);
      if (*pcVar4 != 'l') break;
      if (pcVar4[1] == 'i') goto LAB_005195ba;
LAB_00519627:
      pAVar6 = Saig_ManReadNode(p,pNum2Id,pcVar4);
      p_00 = pFile;
      pcVar4 = Saig_ManReadToken((FILE *)pFile);
      iVar3 = Saig_ManReadNumber(p_00,pcVar4);
      if (pNum2Id == (int *)0x0) {
        sVar7 = strlen(pcVar4);
        lVar8 = sVar7 - 1;
        auVar12._8_4_ = (int)((ulong)lVar8 >> 0x20);
        auVar12._0_8_ = lVar8;
        auVar12._12_4_ = 0x45300000;
        dVar11 = pow(10.0,(auVar12._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar8) - 4503599627370496.0));
        pNum2Id = (int *)calloc((long)(int)dVar11,4);
      }
      pcVar4 = Saig_ManReadToken((FILE *)pFile);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "Saig_ManReadBlif(): Error 15.";
        goto LAB_005193f3;
      }
      p0 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
      if (*pcVar4 != '0') {
        p0 = pAVar5;
      }
      pAVar5 = (Aig_Obj_t *)((ulong)pAVar6 ^ 1);
      if (pcVar4[1] != '0') {
        pAVar5 = pAVar6;
      }
      pcVar4 = Saig_ManReadToken((FILE *)pFile);
      if (((pcVar4 == (char *)0x0) || (*pcVar4 != '1')) || (pcVar4[1] != '\0')) {
        pcVar4 = "Saig_ManReadBlif(): Error 16.";
        goto LAB_005193f3;
      }
      pcVar4 = Saig_ManReadToken((FILE *)pFile);
      if (pcVar4 == (char *)0x0) {
        pcVar4 = "Saig_ManReadBlif(): Error 17.";
        goto LAB_005193f3;
      }
      pAVar5 = Aig_And(p,p0,pAVar5);
      if (((ulong)pAVar5 & 1) != 0) {
        pcVar4 = "Saig_ManReadBlif(): Error 18.";
        goto LAB_005193f3;
      }
      pNum2Id[iVar3] = pAVar5->Id;
    }
    if ((*pcVar4 != 'p') || (pcVar4[1] != 'o')) goto LAB_00519627;
LAB_005195ba:
    pcVar4 = Saig_ManReadToken((FILE *)pFile);
    if (pcVar4 == (char *)0x0) {
      pcVar4 = "Saig_ManReadBlif(): Error 12.";
      goto LAB_005193f3;
    }
    pAVar6 = (Aig_Obj_t *)((ulong)pAVar5 ^ 1);
    if (*pcVar4 != '0') {
      pAVar6 = pAVar5;
    }
    pcVar4 = Saig_ManReadToken((FILE *)pFile);
    if (((pcVar4 == (char *)0x0) || (*pcVar4 != '1')) || (pcVar4[1] != '\0')) {
      pcVar4 = "Saig_ManReadBlif(): Error 13.";
      goto LAB_005193f3;
    }
    Aig_ObjCreateCo(p,pAVar6);
    pcVar4 = Saig_ManReadToken((FILE *)pFile);
  } while (pcVar4 != (char *)0x0);
  pcVar4 = "Saig_ManReadBlif(): Error 14.";
LAB_005193f3:
  puts(pcVar4);
  Aig_ManStop(p);
  return (Aig_Man_t *)0x0;
}

Assistant:

Aig_Man_t * Saig_ManReadBlif( char * pFileName )
{
    FILE * pFile;
    Aig_Man_t * p;
    Aig_Obj_t * pFanin0, * pFanin1, * pNode;
    char * pToken;
    int i, nPis, nPos, nRegs, Number;
    int * pNum2Id = NULL;  // mapping of node numbers in the file into AIG node IDs
    // open the file
    pFile = fopen( pFileName, "r" );
    if ( pFile == NULL )
    {
        printf( "Saig_ManReadBlif(): Cannot open file for reading.\n" );
        return NULL;
    }
    // skip through the comments
    for ( i = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; i++ );
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 1.\n" ); return NULL; }
    // get he model
    pToken = Saig_ManReadToken( pFile );
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 2.\n" ); return NULL; }
    // start the package
    p = Aig_ManStart( 10000 );
    p->pName = Abc_UtilStrsav( pToken );
    p->pSpec = Abc_UtilStrsav( pFileName );
    // count PIs
    pToken = Saig_ManReadToken( pFile );
    if ( pToken == NULL || strcmp( pToken, ".inputs" ) ) 
        { printf( "Saig_ManReadBlif(): Error 3.\n" ); Aig_ManStop(p); return NULL; }
    for ( nPis = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; nPis++ );
    // count POs
    if ( pToken == NULL || strcmp( pToken, ".outputs" ) ) 
        { printf( "Saig_ManReadBlif(): Error 4.\n" ); Aig_ManStop(p); return NULL; }
    for ( nPos = 0; (pToken = Saig_ManReadToken( pFile )) && pToken[0] != '.'; nPos++ );
    // count latches
    if ( pToken == NULL ) 
        { printf( "Saig_ManReadBlif(): Error 5.\n" ); Aig_ManStop(p); return NULL; }
    for ( nRegs = 0; strcmp( pToken, ".latch" ) == 0; nRegs++ )
    {
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 6.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 7.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 8.\n" ); Aig_ManStop(p); return NULL; }
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 9.\n" ); Aig_ManStop(p); return NULL; }
    }
    // create PIs and LOs
    for ( i = 0; i < nPis + nRegs; i++ )
        Aig_ObjCreateCi( p );
    Aig_ManSetRegNum( p, nRegs );
    // create nodes
    for ( i = 0; strcmp( pToken, ".names" ) == 0; i++ )
    {
        // first token
        pToken = Saig_ManReadToken( pFile );
        if ( i == 0 && pToken[0] == 'n' )
        { // constant node
            // read 1
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL || strcmp( pToken, "1" ) ) 
                { printf( "Saig_ManReadBlif(): Error 10.\n" ); Aig_ManStop(p); return NULL; }
            // read next
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 11.\n" ); Aig_ManStop(p); return NULL; }
            continue;
        }
        pFanin0 = Saig_ManReadNode( p, pNum2Id, pToken );

        // second token
        pToken = Saig_ManReadToken( pFile );
        if ( (pToken[0] == 'p' && pToken[1] == 'o') || (pToken[0] == 'l' && pToken[1] == 'i') )
        { // buffer
            // read complemented attribute
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 12.\n" ); Aig_ManStop(p); return NULL; }
            if ( pToken[0] == '0' )
                pFanin0 = Aig_Not(pFanin0);
            // read 1
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL || strcmp( pToken, "1" ) ) 
                { printf( "Saig_ManReadBlif(): Error 13.\n" ); Aig_ManStop(p); return NULL; }
            Aig_ObjCreateCo( p, pFanin0 );
            // read next
            pToken = Saig_ManReadToken( pFile );
            if ( pToken == NULL ) 
                { printf( "Saig_ManReadBlif(): Error 14.\n" ); Aig_ManStop(p); return NULL; }
            continue;
        }

        // third token
        // regular node
        pFanin1 = Saig_ManReadNode( p, pNum2Id, pToken );
        pToken = Saig_ManReadToken( pFile );
        Number = Saig_ManReadNumber( p, pToken );
        // allocate mapping
        if ( pNum2Id == NULL )
        {
//            extern double pow( double x, double y );
            int Size = (int)pow(10.0, (double)(strlen(pToken) - 1));
            pNum2Id = ABC_CALLOC( int, Size );
        }

        // other tokens
        // get the complemented attributes
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 15.\n" ); Aig_ManStop(p); return NULL; }
        if ( pToken[0] == '0' )
            pFanin0 = Aig_Not(pFanin0);
        if ( pToken[1] == '0' )
            pFanin1 = Aig_Not(pFanin1);
        // read 1
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL || strcmp( pToken, "1" ) ) 
            { printf( "Saig_ManReadBlif(): Error 16.\n" ); Aig_ManStop(p); return NULL; }
        // read next
        pToken = Saig_ManReadToken( pFile );
        if ( pToken == NULL ) 
            { printf( "Saig_ManReadBlif(): Error 17.\n" ); Aig_ManStop(p); return NULL; }

        // create new node
        pNode = Aig_And( p, pFanin0, pFanin1 );
        if ( Aig_IsComplement(pNode) )
            { printf( "Saig_ManReadBlif(): Error 18.\n" ); Aig_ManStop(p); return NULL; }
        // set mapping
        pNum2Id[ Number ] = pNode->Id;
    }
    if ( pToken == NULL || strcmp( pToken, ".end" ) ) 
        { printf( "Saig_ManReadBlif(): Error 19.\n" ); Aig_ManStop(p); return NULL; }
    if ( nPos + nRegs != Aig_ManCoNum(p) ) 
        { printf( "Saig_ManReadBlif(): Error 20.\n" ); Aig_ManStop(p); return NULL; }
    // add non-node objects to the mapping
    Aig_ManForEachCi( p, pNode, i )
        pNum2Id[pNode->Id] = pNode->Id;
//    ABC_FREE( pNum2Id );
    p->pData = pNum2Id;
    // check the new manager
    Aig_ManSetRegNum( p, nRegs );
    if ( !Aig_ManCheck(p) )
        printf( "Saig_ManReadBlif(): Check has failed.\n" );
    return p;
}